

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

int canvas_undo_font(_glist *x,void *z,int action)

{
  int iVar1;
  _glist *x_00;
  float fVar2;
  t_floatarg xresize;
  t_floatarg yresize;
  
  if (action - 1U < 2) {
    x_00 = canvas_getrootfor((_glist *)(ulong)(action - 1U));
    fVar2 = 1.0 / *(float *)((long)z + 4);
    xresize = 1.0;
    if (*(int *)((long)z + 8) != 3) {
      xresize = fVar2;
    }
    iVar1 = x_00->gl_font;
    yresize = 1.0;
    if (*(int *)((long)z + 8) != 2) {
      yresize = fVar2;
    }
    canvas_dofont(x_00,(float)*z,xresize,yresize);
    *(float *)((long)z + 4) = fVar2;
    *(int *)z = iVar1;
  }
  else if (z != (void *)0x0 && action == 0) {
    freebytes(z,0xc);
  }
  return 1;
}

Assistant:

int canvas_undo_font(t_canvas *x, void *z, int action)
{
    t_undo_font *u_f = z;

    if (action == UNDO_UNDO || action == UNDO_REDO)
    {
        t_canvas *x2 = canvas_getrootfor(x);
        int tmp_font = x2->gl_font;

        int whichresize = u_f->which;
        t_float realresize = 1./u_f->resize;
        t_float realresx = 1, realresy = 1;
        if (whichresize != 3) realresx = realresize;
        if (whichresize != 2) realresy = realresize;
        canvas_dofont(x2, u_f->font, realresx, realresy);

        u_f->resize = realresize;
        u_f->font = tmp_font;
    }
    else if (action == UNDO_FREE)
    {
        if (u_f)
            freebytes(u_f, sizeof(*u_f));
    }
    return 1;
}